

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O3

void __thiscall imrt::Ant::Ant(Ant *this,Ant *a)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Plan *this_00;
  
  (this->ref_intensity).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ref_intensity).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ref_plan).
  super__Vector_base<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ref_intensity).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ref_plan).
  super__Vector_base<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ref_plan).
  super__Vector_base<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->collimator = a->collimator;
  this_00 = (Plan *)operator_new(0xd0);
  Plan::Plan(this_00,a->p);
  this->p = this_00;
  std::
  vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::operator=(&this->ref_plan,&a->ref_plan);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=(&this->ref_intensity,&a->ref_intensity);
  iVar1 = a->n_stations;
  iVar2 = a->step_intensity;
  iVar3 = a->max_intensity;
  this->n_apertures = a->n_apertures;
  this->n_stations = iVar1;
  this->step_intensity = iVar2;
  this->max_intensity = iVar3;
  return;
}

Assistant:

Ant::Ant(const Ant& a): collimator(a.collimator) {
    p = new Plan (*(a.p));
    ref_plan = a.ref_plan;
    ref_intensity= a.ref_intensity;
    n_stations = a.n_stations;
    n_apertures = a.n_apertures;
    step_intensity= a.step_intensity;
    max_intensity=a.max_intensity;
  }